

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *wrk,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec)

{
  type_conflict5 tVar1;
  long in_RDX;
  long in_RSI;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  int j;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int c;
  int r;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffd78;
  undefined1 local_274 [12];
  self_type *in_stack_fffffffffffffd98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffda0;
  int local_1f4;
  undefined8 local_1e8;
  undefined1 local_1dc [108];
  double in_stack_fffffffffffffe90;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffe98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_15c;
  int local_dc;
  int local_d8;
  uint local_d4;
  long local_d0;
  long local_c8;
  cpp_dec_float<200U,_int,_void> *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  cpp_dec_float<200U,_int,_void> *local_a0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_91;
  const_reference local_90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  const_reference local_70;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  undefined1 *local_60;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_51;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  const_reference local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  const_reference local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  long local_10;
  undefined8 *local_8;
  
  local_d4 = (in_RDI->data)._M_elems[1];
  local_d0 = in_RDX;
  local_c8 = in_RSI;
  while (local_d4 = local_d4 - 1, -1 < (int)local_d4) {
    local_d8 = *(int *)(*(long *)(in_RDI[5].data._M_elems + 4) + (long)(int)local_d4 * 4);
    local_dc = *(int *)(*(long *)(in_RDI[5].data._M_elems + 8) + (long)(int)local_d4 * 4);
    local_48 = std::
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             *)(in_RDI[6].data._M_elems + 0xe),(long)local_d8);
    local_50 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(local_d0 + (long)local_d8 * 0x80);
    local_40 = local_1dc;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_51,local_48,local_50);
    local_38 = local_1dc;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI);
    local_20 = local_1dc;
    local_28 = local_48;
    local_30 = local_50;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (in_RDI,in_stack_fffffffffffffd78,(cpp_dec_float<200U,_int,_void> *)0x6e1703);
    in_stack_fffffffffffffd78 = (cpp_dec_float<200U,_int,_void> *)(local_c8 + (long)local_dc * 0x80)
    ;
    local_a8 = local_1dc;
    local_a0 = in_stack_fffffffffffffd78;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_RDI,in_stack_fffffffffffffd78);
    local_b0 = &local_15c;
    local_b8 = in_stack_fffffffffffffd78;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RDI,in_stack_fffffffffffffd78);
    local_1e8 = 0;
    local_10 = local_d0 + (long)local_d8 * 0x80;
    local_18 = &local_1e8;
    local_8 = local_18;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    tVar1 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffd78,(double *)0x6e1801);
    if (tVar1) {
      for (local_1f4 = *(int *)(*(long *)&in_RDI[7].fpclass + (long)local_dc * 4);
          local_1f4 <
          *(int *)(*(long *)&in_RDI[7].fpclass + (long)local_dc * 4) +
          *(int *)(*(long *)in_RDI[8].data._M_elems + (long)local_dc * 4); local_1f4 = local_1f4 + 1
          ) {
        local_90 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RDI[7].data._M_elems + 0x18),(long)local_1f4);
        local_80 = local_274;
        local_88 = &local_15c;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_91,local_88,local_90);
        local_78 = local_274;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI);
        local_60 = local_274;
        local_68 = local_88;
        local_70 = local_90;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (in_RDI,in_stack_fffffffffffffd78,(cpp_dec_float<200U,_int,_void> *)0x6e1927);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator-=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUright(R* wrk, R* vec) const
{

   for(int i = thedim - 1; i >= 0; i--)
   {
      int  r = row.orig[i];
      int  c = col.orig[i];
      R x = wrk[c] = diag[r] * vec[r];

      vec[r] = 0.0;

      if(x != 0.0)
         //if (isNotZero(x))
      {
         for(int j = u.col.start[c]; j < u.col.start[c] + u.col.len[c]; j++)
            vec[u.col.idx[j]] -= x * u.col.val[j];
      }
   }
}